

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzDDD::NodeIntLoadResidual_F
          (ChNodeFEAxyzDDD *this,uint off,ChVectorDynamic<> *R,double c)

{
  double *pdVar1;
  Index index;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  
  uVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows - 3;
  if ((long)uVar4 < (long)(ulong)off) goto LAB_00656f95;
  pdVar1 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar2 = 3;
  pdVar3 = pdVar1 + off;
  if (((ulong)pdVar3 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar2 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_00656d91;
  }
  else {
LAB_00656d91:
    uVar6 = 0;
    do {
      pdVar3[uVar6] =
           c * (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.Force.m_data
               [uVar6] + pdVar3[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  if (uVar2 < 3) {
    do {
      pdVar3[uVar2] =
           c * (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.Force.m_data
               [uVar2] + pdVar3[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar2 != 3);
  }
  if ((long)uVar4 < (long)(ulong)(off + 3)) goto LAB_00656f95;
  pdVar3 = pdVar1 + (off + 3);
  if (((ulong)pdVar3 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
    uVar5 = 3;
    if (uVar7 < 3) {
      uVar5 = uVar7;
    }
    if (uVar7 != 0) {
      uVar7 = uVar5 ^ 3;
      goto LAB_00656e23;
    }
    sVar8 = 0x18;
    uVar2 = 0;
  }
  else {
    uVar5 = 3;
    uVar7 = 0;
LAB_00656e23:
    uVar2 = (ulong)(uVar5 * 8);
    memset(pdVar3,0,uVar2);
    sVar8 = (size_t)(uVar7 << 3);
  }
  if (uVar5 < 3) {
    memset((void *)((long)pdVar3 + uVar2),0,sVar8);
  }
  if (uVar4 < off + 6) goto LAB_00656f95;
  pdVar1 = pdVar1 + (off + 6);
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    uVar5 = 3;
    if (uVar7 < 3) {
      uVar5 = uVar7;
    }
    if (uVar7 != 0) {
      uVar7 = uVar5 ^ 3;
      goto LAB_00656ea0;
    }
    sVar8 = 0x18;
    uVar4 = 0;
  }
  else {
    uVar5 = 3;
    uVar7 = 0;
LAB_00656ea0:
    uVar4 = (ulong)(uVar5 * 8);
    memset(pdVar1,0,uVar4);
    sVar8 = (size_t)(uVar7 << 3);
  }
  if (uVar5 < 3) {
    memset((void *)((long)pdVar1 + uVar4),0,sVar8);
  }
  if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
      (long)(ulong)(off + 9)) {
LAB_00656f95:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar3 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
           (off + 9);
  if (((ulong)pdVar3 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
    uVar5 = 3;
    if (uVar7 < 3) {
      uVar5 = uVar7;
    }
    if (uVar7 == 0) {
      sVar8 = 0x18;
      uVar4 = 0;
      goto LAB_00656f3b;
    }
    uVar7 = uVar5 ^ 3;
  }
  else {
    uVar5 = 3;
    uVar7 = 0;
  }
  uVar4 = (ulong)(uVar5 * 8);
  memset(pdVar3,0,uVar4);
  sVar8 = (size_t)(uVar7 << 3);
LAB_00656f3b:
  if (uVar5 < 3) {
    memset((void *)((long)pdVar3 + uVar4),0,sVar8);
    return;
  }
  return;
}

Assistant:

void ChNodeFEAxyzDDD::NodeIntLoadResidual_F(const unsigned int off, ChVectorDynamic<>& R, const double c) {
    R.segment(off + 0, 3) += c * Force.eigen();
    R.segment(off + 3, 3).setZero();  // TODO something about applied nodal torque..
    R.segment(off + 6, 3).setZero();  // TODO something about applied nodal torque..
	R.segment(off + 9, 3).setZero();  // TODO something about applied nodal torque..
}